

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_annotator.h
# Opt level: O2

bool __thiscall
flatbuffers::BinaryAnnotator::IsValidUnionValue
          (BinaryAnnotator *this,uint32_t enum_id,uint8_t value)

{
  Vector<flatbuffers::Offset<reflection::Enum>,_unsigned_int> *pVVar1;
  return_type this_00;
  Vector<flatbuffers::Offset<reflection::EnumVal>,_unsigned_int> *pVVar2;
  
  pVVar1 = reflection::Schema::enums(this->schema_);
  if (enum_id < *(uint *)pVVar1) {
    pVVar1 = reflection::Schema::enums(this->schema_);
    this_00 = Vector<flatbuffers::Offset<reflection::Enum>,_unsigned_int>::Get(pVVar1,enum_id);
    if (this_00 != (return_type)0x0) {
      pVVar2 = reflection::Enum::values(this_00);
      return (uint)value < *(uint *)pVVar2;
    }
  }
  return false;
}

Assistant:

bool IsValidUnionValue(const uint32_t enum_id, const uint8_t value) {
    if (enum_id >= schema_->enums()->size()) { return false; }

    const reflection::Enum *enum_def = schema_->enums()->Get(enum_id);

    if (enum_def == nullptr) { return false; }

    return value < enum_def->values()->size();
  }